

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

BSDFSample * __thiscall
pbrt::ThinDielectricBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,ThinDielectricBxDF *this,Vector3f wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  
  auVar15._4_60_ = wo._12_60_;
  auVar15._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._8_56_ = wo._8_56_;
  auVar14._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  fVar16 = 1.0;
  auVar9 = auVar15._0_16_;
  auVar17 = SUB6416(ZEXT464(0x3f800000),0);
  auVar8 = vminss_avx(auVar17,auVar9);
  uVar1 = vcmpss_avx512f(auVar17,auVar9,1);
  bVar2 = (bool)((byte)uVar1 & 1);
  bVar5 = auVar15._0_4_ < -1.0;
  fVar7 = (float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar8._0_4_);
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar9,auVar8);
  bVar6 = 0.0 < fVar7;
  fVar11 = auVar8._0_4_;
  auVar9._4_12_ = auVar8._4_12_;
  auVar9._0_4_ = (uint)bVar6 * (int)fVar7 +
                 (uint)!bVar6 *
                 ((uint)bVar5 * 0x3f800000 +
                 (uint)!bVar5 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * (int)fVar11));
  fVar7 = (float)((uint)bVar6 * (int)this->eta + (uint)!bVar6 * (int)(1.0 / this->eta));
  auVar10 = ZEXT416((uint)fVar7);
  auVar8 = vfnmadd213ss_fma(auVar9,auVar9,auVar17);
  auVar8 = vmaxss_avx(auVar8,ZEXT816(0) << 0x40);
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  auVar17._0_4_ = auVar8._0_4_ / fVar7;
  auVar17._4_12_ = auVar8._4_12_;
  fVar7 = 0.0;
  if (auVar17._0_4_ < 1.0) {
    auVar8 = vfnmadd213ss_fma(auVar17,auVar17,SUB6416(ZEXT464(0x3f800000),0));
    auVar8 = vmaxss_avx(auVar8,ZEXT816(0));
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    auVar12 = vfmsub213ss_fma(auVar9,auVar10,auVar8);
    auVar17 = vfmadd213ss_fma(auVar9,auVar10,auVar8);
    auVar18._0_4_ = auVar12._0_4_ / auVar17._0_4_;
    auVar18._4_12_ = auVar12._4_12_;
    auVar17 = vfnmadd213ss_fma(auVar8,auVar10,auVar9);
    auVar8 = vfmadd213ss_fma(auVar8,auVar10,auVar9);
    fVar16 = auVar17._0_4_ / auVar8._0_4_;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar18,auVar18);
    fVar16 = auVar8._0_4_ * 0.5;
    fVar7 = 1.0 - fVar16;
    if (fVar16 < 1.0) {
      auVar8 = vfnmadd213ss_fma(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),
                                SUB6416(ZEXT464(0x3f800000),0));
      fVar16 = fVar16 + (fVar16 * fVar7 * fVar7) / auVar8._0_4_;
      fVar7 = 1.0 - fVar16;
    }
  }
  fVar3 = (float)((uint)((byte)sampleFlags & 1) * (int)fVar16);
  fVar4 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)fVar7);
  if (((fVar3 == 0.0) && (fVar4 == 0.0)) && (!NAN(fVar4))) {
    __return_storage_ptr__->flags = Unset;
    auVar13 = ZEXT832(0) << 0x20;
    __return_storage_ptr__->f = (SampledSpectrum)auVar13._0_16_;
    __return_storage_ptr__->wi = (Vector3f)auVar13._16_12_;
    __return_storage_ptr__->pdf = (Float)auVar13._28_4_;
    return __return_storage_ptr__;
  }
  fVar19 = fVar3 / (fVar3 + fVar4);
  if (fVar19 <= uc) {
    fVar7 = fVar7 / fVar11;
    auVar12._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
    auVar12._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    auVar12._12_4_ = wo._12_4_ ^ 0x80000000;
    (__return_storage_ptr__->f).values.values[0] = fVar7;
    (__return_storage_ptr__->f).values.values[1] = fVar7;
    (__return_storage_ptr__->f).values.values[2] = fVar7;
    (__return_storage_ptr__->f).values.values[3] = fVar7;
    uVar1 = vmovlps_avx(auVar12);
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = -auVar15._0_4_;
    __return_storage_ptr__->pdf = fVar4 / (fVar3 + fVar4);
    __return_storage_ptr__->flags = SpecularTransmission;
    return __return_storage_ptr__;
  }
  fVar16 = fVar16 / fVar11;
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(auVar14._0_16_,auVar10);
  (__return_storage_ptr__->f).values.values[0] = fVar16;
  (__return_storage_ptr__->f).values.values[1] = fVar16;
  (__return_storage_ptr__->f).values.values[2] = fVar16;
  (__return_storage_ptr__->f).values.values[3] = fVar16;
  uVar1 = vmovlps_avx(auVar8);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = auVar15._0_4_;
  __return_storage_ptr__->pdf = fVar19;
  __return_storage_ptr__->flags = SpecularReflection;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute _R_ and _T_ accounting for scattering between interfaces
        if (R < 1) {
            R += T * T * R / (1 - R * R);
            T = 1 - R;
        }

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at thin dielectric interface
            Vector3f wi = -wo;
            SampledSpectrum ft(T / AbsCosTheta(wi));
            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission);
        }
    }